

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O2

char * duckdb_parameter_name(duckdb_prepared_statement prepared_statement,idx_t index)

{
  __type _Var1;
  char *pcVar2;
  string identifier;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  duckdb_parameter_name_internal_abi_cxx11_(&local_50,prepared_statement,index);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  _Var1 = std::operator==(&local_50,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (_Var1) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = strdup(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return pcVar2;
}

Assistant:

const char *duckdb_parameter_name(duckdb_prepared_statement prepared_statement, idx_t index) {
	auto identifier = duckdb_parameter_name_internal(prepared_statement, index);
	if (identifier == duckdb::string()) {
		return NULL;
	}
	return strdup(identifier.c_str());
}